

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

UDisplayContext __thiscall
icu_63::NumberFormat::getContext(NumberFormat *this,UDisplayContextType type,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UDisplayContextType type_local;
  NumberFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (type == UDISPCTX_TYPE_CAPITALIZATION) {
      this_local._4_4_ = this->fCapitalizationContext;
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = UDISPCTX_STANDARD_NAMES;
    }
  }
  else {
    this_local._4_4_ = UDISPCTX_STANDARD_NAMES;
  }
  return this_local._4_4_;
}

Assistant:

UDisplayContext NumberFormat::getContext(UDisplayContextType type, UErrorCode& status) const
{
    if (U_FAILURE(status))
        return (UDisplayContext)0;
    if (type != UDISPCTX_TYPE_CAPITALIZATION) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return (UDisplayContext)0;
    }
    return fCapitalizationContext;
}